

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O2

bool bitmap_operation::BlackGrayScaleImage(void)

{
  bool bVar1;
  allocator local_79;
  Image loaded;
  Image original;
  string local_28;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&loaded,0,0,'\x01','\x01');
  Unit_Test::blackImage(&original,&loaded);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&loaded);
  std::__cxx11::string::string((string *)&loaded,"bitmap.bmp",(allocator *)&local_28);
  Bitmap_Operation::Save((string *)&loaded,&original);
  std::__cxx11::string::~string((string *)&loaded);
  std::__cxx11::string::string((string *)&local_28,"bitmap.bmp",&local_79);
  Bitmap_Operation::Load(&loaded,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  remove("bitmap.bmp");
  if (((original._height == loaded._height) && (original._width == loaded._width)) &&
     (original._colorCount == loaded._colorCount)) {
    bVar1 = Unit_Test::verifyImage(&loaded,'\0');
  }
  else {
    bVar1 = false;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&loaded);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&original);
  return bVar1;
}

Assistant:

bool BlackGrayScaleImage()
    {
        const PenguinV_Image::Image original = Unit_Test::blackImage();
        Bitmap_Operation::Save( "bitmap.bmp", original );

        const PenguinV_Image::Image loaded = Bitmap_Operation::Load( "bitmap.bmp" );
        remove("bitmap.bmp");

        if( original.height() != loaded.height() || original.width() != loaded.width() ||
            original.colorCount() != loaded.colorCount() || !Unit_Test::verifyImage( loaded, 0u ) )
            return false;

        return true;
    }